

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.h
# Opt level: O1

void __thiscall WrapperCommand::execute(WrapperCommand *this,CmdParams *params,CmdContext *context)

{
  int iVar1;
  Executable *pEVar2;
  MappedExe *exe;
  size_t sVar3;
  undefined4 extraout_var;
  string local_40;
  
  pEVar2 = cmd_util::getExeFromContext(context);
  exe = (MappedExe *)__dynamic_cast(pEVar2,&Executable::typeinfo,&MappedExe::typeinfo,0);
  if (exe != (MappedExe *)0x0) {
    sVar3 = this->wrapperId;
    if (sVar3 == 0xffffffffffffffff) {
      cmd_util::printWrapperNames(exe);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"wrapperNum","");
      sVar3 = cmd_util::readNumber(&local_40,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    iVar1 = (*(exe->super_ExeWrappersContainer)._vptr_ExeWrappersContainer[2])
                      (&exe->super_ExeWrappersContainer,sVar3);
    if (CONCAT44(extraout_var,iVar1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"No such wrapper!",0x10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
    }
    else {
      (*(this->super_Command)._vptr_Command[5])(this,CONCAT44(extraout_var,iVar1));
    }
  }
  return;
}

Assistant:

virtual void execute(CmdParams *params, CmdContext  *context)
    {
        MappedExe *mappedExe = cmd_util::getMappedExeFromContext(context);
        if (mappedExe == NULL) return;

        size_t wrId = wrapperId;
        if (wrId == INVALID_WRAPPER) {
            cmd_util::printWrapperNames(mappedExe);
            wrId = cmd_util::readNumber("wrapperNum", false);
        }
        ExeElementWrapper *wrapper = mappedExe->getWrapper(wrId);
        if (wrapper == NULL) {
            std::cout << "No such wrapper!" << std::endl;
            return;
        }
        wrapperAction(wrapper);
    }